

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O2

void __thiscall
SAUF<UFPC>::PerformLabelingMem
          (SAUF<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer piVar6;
  SAUF<UFPC> *pSVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  uint uVar9;
  long lVar10;
  int r;
  long lVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  void *in_R8;
  long lVar17;
  int c;
  long lVar18;
  ulong uVar19;
  double dVar20;
  allocator_type local_2b9;
  SAUF<UFPC> *local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2a0;
  long local_298;
  MemMat<int> img_labels;
  value_type_conflict3 local_1c8;
  Size local_1c0;
  Mat_<int> local_1b8;
  MemMat<unsigned_char> img;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar4->field_0x8;
  uVar16 = *(uint *)&pMVar4->field_0xc;
  UFPC::MemAlloc(((int)(uVar9 + 1) / 2) * ((int)(uVar16 + 1) / 2) + 1);
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  local_2a0 = accesses;
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1c0.height = (int)uVar2;
  local_1c0.width = (int)((ulong)uVar2 >> 0x20);
  uVar19 = 0;
  local_2b8 = this;
  MemMat<int>::MemMat(&img_labels,&local_1c0,0);
  UFPC::MemSetup();
  local_298 = (long)(int)uVar16 + -1;
  uVar15 = 0;
  if (0 < (int)uVar16) {
    uVar15 = (ulong)uVar16;
  }
  local_2b0 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    local_2b0 = uVar19;
  }
  lVar14 = -1;
  local_2a8 = uVar15;
  do {
    if (uVar19 == local_2b0) {
      uVar9 = UFPC::MemFlatten();
      pSVar7 = local_2b8;
      (local_2b8->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
      for (uVar15 = 0;
          piVar6 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          puVar5 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar19 = local_2a8 & 0xffffffff,
          lVar14 = img_labels.accesses_._16_8_, pvVar13 = (void *)img_labels.img_._16_8_,
          uVar15 != local_2b0; uVar15 = uVar15 + 1) {
        while (uVar19 != 0) {
          lVar17 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar14 + lVar17 * uVar15);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)img_labels.img_._72_8_;
          iVar3 = *(int *)((long)pvVar13 + lVar18 * uVar15);
          piVar6[iVar3] = piVar6[iVar3] + 1;
          uVar9 = puVar5[iVar3];
          piVar1 = (int *)(lVar14 + lVar17 * uVar15);
          *piVar1 = *piVar1 + 1;
          *(uint *)((long)pvVar13 + lVar18 * uVar15) = uVar9;
          uVar19 = uVar19 - 1;
          lVar14 = lVar14 + 4;
          pvVar13 = (void *)((long)pvVar13 + 4);
        }
        in_R8 = pvVar13;
      }
      local_1c8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,4,&local_1c8,
                 &local_2b9);
      pvVar8 = local_2a0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_2a0,&local_1b8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
      dVar20 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
      dVar20 = MemMat<int>::GetTotalAccesses(&img_labels);
      (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)dVar20 >> 0x3f & (long)(dVar20 - 9.223372036854776e+18) | (long)dVar20;
      dVar20 = UFPC::MemTotalAccesses();
      pvVar13 = (void *)((long)dVar20 >> 0x3f & (long)(dVar20 - 9.223372036854776e+18) |
                        (long)dVar20);
      (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)pvVar13;
      cv::Mat_<int>::clone
                (&local_1b8,(__fn *)&img_labels.img_,pvVar13,
                 (int)(long)(dVar20 - 9.223372036854776e+18),in_R8);
      cv::Mat::operator=(&((pSVar7->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_1b8.super_Mat);
      cv::Mat::~Mat(&local_1b8.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    lVar18 = 0;
    lVar17 = -1;
    while (lVar17 - uVar15 != -1) {
      lVar12 = *(long *)img.accesses_._72_8_;
      lVar10 = lVar12 * uVar19 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar10 + 4 + lVar17 * 4);
      *piVar1 = *piVar1 + 1;
      in_R8 = *(void **)img.img_._72_8_;
      lVar11 = (long)in_R8 * uVar19 + img.img_._16_8_;
      if (*(char *)(lVar17 + 1 + lVar11) != '\0') {
        if (uVar19 == 0) {
          lVar12 = lVar17;
          if (lVar17 == -1) {
LAB_001b39bb:
            uVar9 = UFPC::MemNewLabel();
LAB_001b39c0:
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar19 +
                             img_labels.accesses_._16_8_ + 4 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)img_labels.img_._72_8_ * uVar19 + img_labels.img_._16_8_;
          }
          else {
LAB_001b38ab:
            piVar1 = (int *)(lVar10 + lVar12 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar11 + lVar12) == '\0') goto LAB_001b39bb;
            lVar11 = *(long *)img_labels.accesses_._72_8_ * uVar19 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar11 + lVar12 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)img_labels.img_._72_8_ * uVar19 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar10 + lVar12 * 4);
            piVar1 = (int *)(lVar11 + 4 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
          lVar12 = img.accesses_._16_8_ + lVar12 * lVar14;
          piVar1 = (int *)(lVar12 + 4 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          in_R8 = (void *)((long)in_R8 * lVar14);
          if (*(char *)((long)in_R8 + lVar17 + 1 + img.img_._16_8_) == '\0') {
            if ((lVar17 + 1 < local_298) &&
               (piVar1 = (int *)(lVar12 + 8 + lVar17 * 4), *piVar1 = *piVar1 + 1,
               *(char *)((long)in_R8 + lVar17 + 2 + img.img_._16_8_) != '\0')) {
              if (lVar17 == -1) {
LAB_001b3a75:
                lVar12 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar14 * lVar12 + img_labels.accesses_._16_8_ + 8 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar14 * lVar10 + img_labels.img_._16_8_ + 8 + lVar17 * 4);
                goto LAB_001b3886;
              }
              piVar1 = (int *)(lVar12 + lVar17 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)in_R8 + lVar17 + img.img_._16_8_) == '\0') {
                piVar1 = (int *)(lVar10 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar17 + lVar11) == '\0') goto LAB_001b3a75;
                lVar12 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(uVar19 * lVar12 + img_labels.accesses_._16_8_ + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(uVar19 * lVar10 + img_labels.img_._16_8_ + lVar17 * 4);
                piVar1 = (int *)(lVar12 * lVar14 + img_labels.accesses_._16_8_ + 8 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(uint *)(lVar10 * lVar14 + img_labels.img_._16_8_ + 8 + lVar17 * 4);
              }
              else {
                lVar12 = *(long *)img_labels.accesses_._72_8_ * lVar14 + img_labels.accesses_._16_8_
                ;
                piVar1 = (int *)(lVar12 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *(long *)img_labels.img_._72_8_ * lVar14 + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar10 + lVar17 * 4);
                piVar1 = (int *)(lVar12 + 8 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(uint *)(lVar10 + 8 + lVar17 * 4);
              }
              uVar9 = UFPC::MemMerge(uVar9,uVar16);
              goto LAB_001b39c0;
            }
            if (lVar17 == -1) goto LAB_001b39bb;
            piVar1 = (int *)(lVar12 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)in_R8 + lVar17 + img.img_._16_8_) == '\0') {
              lVar12 = lVar18 + -1;
              goto LAB_001b38ab;
            }
            lVar12 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar14 * lVar12 + img_labels.accesses_._16_8_ + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar14 * lVar10 + img_labels.img_._16_8_ + lVar17 * 4);
          }
          else {
            lVar12 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar14 * lVar12 + img_labels.accesses_._16_8_ + 4 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar14 * lVar10 + img_labels.img_._16_8_ + 4 + lVar17 * 4);
          }
LAB_001b3886:
          piVar1 = (int *)(lVar12 * uVar19 + img_labels.accesses_._16_8_ + 4 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          lVar10 = lVar10 * uVar19 + img_labels.img_._16_8_;
        }
        *(uint *)(lVar10 + 4 + lVar17 * 4) = uVar9;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 1;
    }
    uVar19 = uVar19 + 1;
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY); // Equivalence solver

        // Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemSetup();

        // First scan

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img(r - 1 , c - 1) > 0
#define CONDITION_Q r > 0 && img(r - 1, c)>0
#define CONDITION_R c < w - 1 && r > 0 && img(r - 1,c + 1) > 0
#define CONDITION_S c > 0 && img(r,c - 1)>0
#define CONDITION_X img(r,c)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r - 1, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"              
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::MemFlatten();

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
                img_labels(r, c) = LabelsSolver::MemGetLabel(img_labels(r, c));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }